

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_edge_offset_class0
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  byte bVar1;
  ulong __n;
  long lVar2;
  UWORD8 *pUVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  UWORD8 au1_src_left_tmp [64];
  undefined8 uStack_c0;
  byte local_b8 [64];
  UWORD8 local_78 [72];
  
  local_b8[0] = 0xff;
  local_b8[1] = 0xff;
  local_b8[2] = 0xff;
  local_b8[3] = 0xff;
  local_b8[4] = 0xff;
  local_b8[5] = 0xff;
  local_b8[6] = 0xff;
  local_b8[7] = 0xff;
  local_b8[8] = 0xff;
  local_b8[9] = 0xff;
  local_b8[10] = 0xff;
  local_b8[0xb] = 0xff;
  local_b8[0xc] = 0xff;
  local_b8[0xd] = 0xff;
  local_b8[0xe] = 0xff;
  local_b8[0xf] = 0xff;
  local_b8[0x10] = 0xff;
  local_b8[0x11] = 0xff;
  local_b8[0x12] = 0xff;
  local_b8[0x13] = 0xff;
  local_b8[0x14] = 0xff;
  local_b8[0x15] = 0xff;
  local_b8[0x16] = 0xff;
  local_b8[0x17] = 0xff;
  local_b8[0x18] = 0xff;
  local_b8[0x19] = 0xff;
  local_b8[0x1a] = 0xff;
  local_b8[0x1b] = 0xff;
  local_b8[0x1c] = 0xff;
  local_b8[0x1d] = 0xff;
  local_b8[0x1e] = 0xff;
  local_b8[0x1f] = 0xff;
  local_b8[0x20] = 0xff;
  local_b8[0x21] = 0xff;
  local_b8[0x22] = 0xff;
  local_b8[0x23] = 0xff;
  local_b8[0x24] = 0xff;
  local_b8[0x25] = 0xff;
  local_b8[0x26] = 0xff;
  local_b8[0x27] = 0xff;
  local_b8[0x28] = 0xff;
  local_b8[0x29] = 0xff;
  local_b8[0x2a] = 0xff;
  local_b8[0x2b] = 0xff;
  local_b8[0x2c] = 0xff;
  local_b8[0x2d] = 0xff;
  local_b8[0x2e] = 0xff;
  local_b8[0x2f] = 0xff;
  local_b8[0x30] = 0xff;
  local_b8[0x31] = 0xff;
  local_b8[0x32] = 0xff;
  local_b8[0x33] = 0xff;
  local_b8[0x34] = 0xff;
  local_b8[0x35] = 0xff;
  local_b8[0x36] = 0xff;
  local_b8[0x37] = 0xff;
  local_b8[0x38] = 0xff;
  local_b8[0x39] = 0xff;
  local_b8[0x3a] = 0xff;
  local_b8[0x3b] = 0xff;
  local_b8[0x3c] = 0xff;
  local_b8[0x3d] = 0xff;
  local_b8[0x3e] = 0xff;
  local_b8[0x3f] = 0xff;
  lVar2 = (long)wd;
  *pu1_src_top_left = pu1_src_top[lVar2 + -1];
  __n = (ulong)(uint)ht;
  if (0 < ht) {
    pUVar3 = pu1_src + lVar2 + -1;
    uVar7 = 0;
    do {
      local_78[uVar7] = *pUVar3;
      uVar7 = uVar7 + 1;
      pUVar3 = pUVar3 + src_strd;
    } while (__n != uVar7);
  }
  if (0 < wd) {
    uVar7 = 0;
    do {
      pu1_src_top[uVar7] = pu1_src[uVar7 + (long)((ht + -1) * src_strd)];
      uVar7 = uVar7 + 1;
    } while ((uint)wd != uVar7);
  }
  if (*pu1_avail == '\0') {
    local_b8[0] = 0;
    local_b8[1] = 0xff;
    local_b8[2] = 0xff;
    local_b8[3] = 0xff;
  }
  if (pu1_avail[1] == '\0') {
    *(undefined1 *)((long)&uStack_c0 + lVar2 + 7) = 0;
  }
  if (0 < ht) {
    uVar7 = 0;
    do {
      if (0 < wd) {
        uVar5 = (uint)(*pu1_src != pu1_src_left[uVar7]);
        if (*pu1_src < pu1_src_left[uVar7]) {
          uVar5 = 0xffffffff;
        }
        uVar8 = 0;
        do {
          bVar1 = pu1_src[uVar8];
          uVar4 = (uint)(bVar1 != pu1_src[uVar8 + 1]);
          if (bVar1 < pu1_src[uVar8 + 1]) {
            uVar4 = 0xffffffff;
          }
          if (((uint)local_b8[uVar8] & gi4_ihevc_table_edge_idx[uVar4 + uVar5 + 2]) != 0) {
            iVar6 = (int)pi1_sao_offset
                         [(uint)local_b8[uVar8] & gi4_ihevc_table_edge_idx[uVar4 + uVar5 + 2]] +
                    (uint)bVar1;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            pu1_src[uVar8] = (byte)iVar6;
          }
          uVar8 = uVar8 + 1;
          uVar5 = -uVar4;
        } while ((uint)wd != uVar8);
      }
      pu1_src = pu1_src + src_strd;
      uVar7 = uVar7 + 1;
    } while (uVar7 != __n);
  }
  if (0 < ht) {
    uStack_c0 = 0x15f913;
    memcpy(pu1_src_left,local_78,__n);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class0(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    WORD8 u1_sign_left, u1_sign_right;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);
    bit_depth = BIT_DEPTH_LUMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update top and top-left arrays */
    *pu1_src_top_left = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update masks based on the availability flags */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            u1_sign_left = SIGN(pu1_src[0] - pu1_src_left[row]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_right = SIGN(pu1_src[col] - pu1_src[col + 1]);
                edge_idx = 2 + u1_sign_left + u1_sign_right;
                u1_sign_left = -u1_sign_right;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    /* Update left array */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }

}